

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

Vec4 __thiscall
gl4cts::TextureViewTestViewSampling::getRandomReferenceColor(TextureViewTestViewSampling *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  Vec4 VVar3;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar1 = (getRandomReferenceColor::seed << 5) % 0xff;
  VVar3.m_data[2] = (getRandomReferenceColor::seed << 4) % 0xff;
  VVar3.m_data[3] = (float)uVar1;
  auVar2._0_4_ = (float)(getRandomReferenceColor::seed % 0xff);
  auVar2._4_4_ = (float)((getRandomReferenceColor::seed * 8) % 0xff);
  auVar2._8_4_ = (float)VVar3.m_data[2];
  auVar2._12_4_ = (float)uVar1;
  auVar2 = divps(auVar2,_DAT_016f3560);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)auVar2._0_8_;
  (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)auVar2._8_8_;
  getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
  VVar3.m_data._0_8_ = auVar2._0_8_;
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 TextureViewTestViewSampling::getRandomReferenceColor()
{
	static unsigned int seed = 195;
	tcu::Vec4			result;

	result = tcu::Vec4(float((seed) % 255) / 255.0f, float((seed << 3) % 255) / 255.0f,
					   float((seed << 4) % 255) / 255.0f, float((seed << 5) % 255) / 255.0f);

	seed += 17;

	return result;
}